

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDDD.cpp
# Opt level: O1

ChNodeFEAxyzDDD * __thiscall
chrono::fea::ChNodeFEAxyzDDD::operator=(ChNodeFEAxyzDDD *this,ChNodeFEAxyzDDD *other)

{
  if (other != this) {
    ChNodeFEAxyzDD::operator=(&this->super_ChNodeFEAxyzDD,&other->super_ChNodeFEAxyzDD);
    *(undefined8 *)&(this->super_ChNodeFEAxyzDD).field_0x190 =
         *(undefined8 *)&(other->super_ChNodeFEAxyzDD).field_0x190;
    *(undefined8 *)&this->field_0x198 = *(undefined8 *)&other->field_0x198;
    *(undefined8 *)&this->field_0x1a0 = *(undefined8 *)&other->field_0x1a0;
    (this->DDD_dt).m_data[0] = (other->DDD_dt).m_data[0];
    (this->DDD_dt).m_data[1] = (other->DDD_dt).m_data[1];
    (this->DDD_dt).m_data[2] = (other->DDD_dt).m_data[2];
    (this->DDD_dtdt).m_data[0] = (other->DDD_dtdt).m_data[0];
    (this->DDD_dtdt).m_data[1] = (other->DDD_dtdt).m_data[1];
    (this->DDD_dtdt).m_data[2] = (other->DDD_dtdt).m_data[2];
    ChVariablesGenericDiagonalMass::operator=
              (*(ChVariablesGenericDiagonalMass **)&(this->super_ChNodeFEAxyzDD).field_0x188,
               *(ChVariablesGenericDiagonalMass **)&(other->super_ChNodeFEAxyzDD).field_0x188);
  }
  return this;
}

Assistant:

ChNodeFEAxyzDDD& ChNodeFEAxyzDDD::operator=(const ChNodeFEAxyzDDD& other) {
    if (&other == this)
        return *this;

    ChNodeFEAxyzDD::operator=(other);

    DDD = other.DDD;
    DDD_dt = other.DDD_dt;
    DDD_dtdt = other.DDD_dtdt;
    (*variables_DDD) = (*other.variables_DDD);
    return *this;
}